

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O2

void SpookyHash::Short(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  ulong uVar1;
  uint *puVar2;
  uint64 b;
  uint64 a;
  uint64 local_70;
  uint64 local_68;
  uint64 local_60;
  uint64 local_58;
  size_t local_50;
  uint64 *local_48;
  uint64 *local_40;
  ulong local_38;
  
  local_58 = *hash1;
  uVar1 = (ulong)((uint)length & 0x1f);
  local_60 = *hash2;
  local_70 = 0xdeadbeefdeadbeef;
  local_68 = 0xdeadbeefdeadbeef;
  if (0xf < length) {
    puVar2 = (uint *)((length & 0xffffffffffffffe0) + (long)message);
    local_50 = length;
    local_48 = hash1;
    local_40 = hash2;
    local_38 = uVar1;
    for (; uVar1 = local_38, message < puVar2; message = (void *)((long)message + 0x20)) {
      local_70 = local_70 + *message;
      local_68 = local_68 + *(long *)((long)message + 8);
      ShortMix(&local_58,&local_60,&local_70,&local_68);
      local_58 = local_58 + *(long *)((long)message + 0x10);
      local_60 = local_60 + *(long *)((long)message + 0x18);
    }
    length = local_50;
    hash2 = local_40;
    hash1 = local_48;
    if (0xf < (uint)local_38) {
      local_70 = local_70 + *message;
      local_68 = local_68 + *(long *)((long)message + 8);
      ShortMix(&local_58,&local_60,&local_70,&local_68);
      message = (void *)((long)message + 0x10);
      uVar1 = uVar1 - 0x10;
      length = local_50;
      hash2 = local_40;
      hash1 = local_48;
    }
  }
  local_68 = length << 0x38;
  switch(uVar1) {
  case 0:
    local_70 = local_70 + 0xdeadbeefdeadbeef;
    local_68 = local_68 + 0xdeadbeefdeadbeef;
    goto switchD_00172fb6_default;
  case 1:
    goto LAB_00173073;
  case 2:
    break;
  case 3:
    local_70 = (ulong)*(byte *)((long)message + 2) * 0x10000 + local_70;
    break;
  case 4:
    goto LAB_001730aa;
  case 5:
    goto LAB_0017309e;
  case 6:
    goto LAB_0017308d;
  case 7:
    local_70 = ((ulong)*(byte *)((long)message + 6) << 0x30) + local_70;
LAB_0017308d:
    local_70 = ((ulong)*(byte *)((long)message + 5) << 0x28) + local_70;
LAB_0017309e:
    local_70 = ((ulong)(byte)*(uint *)((long)message + 4) << 0x20) + local_70;
LAB_001730aa:
    local_70 = *message + local_70;
    goto switchD_00172fb6_default;
  case 8:
    goto switchD_00172fb6_caseD_8;
  case 0xb:
    local_68 = local_68 | (ulong)*(byte *)((long)message + 10) << 0x10;
  case 10:
    local_68 = local_68 + (ulong)*(byte *)((long)message + 9) * 0x100;
  case 9:
    uVar1 = (ulong)(byte)*(uint *)((long)message + 8);
    goto LAB_00173020;
  case 0xf:
    local_68 = local_68 | (ulong)*(byte *)((long)message + 0xe) << 0x30;
  case 0xe:
    local_68 = local_68 + ((ulong)*(byte *)((long)message + 0xd) << 0x28);
  case 0xd:
    local_68 = local_68 + ((ulong)(byte)*(uint *)((long)message + 0xc) << 0x20);
  case 0xc:
    uVar1 = (ulong)*(uint *)((long)message + 8);
LAB_00173020:
    local_68 = uVar1 + local_68;
switchD_00172fb6_caseD_8:
    local_70 = local_70 + *message;
  default:
    goto switchD_00172fb6_default;
  }
  local_70 = (ulong)*(byte *)((long)message + 1) * 0x100 + local_70;
LAB_00173073:
  local_70 = (byte)*message + local_70;
switchD_00172fb6_default:
  ShortEnd(&local_58,&local_60,&local_70,&local_68);
  *hash1 = local_58;
  *hash2 = local_60;
  return;
}

Assistant:

void SpookyHash::Short(
    const void *message,
    size_t length,
    uint64 *hash1,
    uint64 *hash2)
{
    uint64 buf[sc_numVars];
    union 
    { 
        const uint8 *p8; 
        uint32 *p32;
        uint64 *p64; 
        size_t i; 
    } u;

    u.p8 = (const uint8 *)message;
    
    if (!ALLOW_UNALIGNED_READS && (u.i & 0x7))
    {
        memcpy(buf, message, length);
        u.p64 = buf;
    }

    size_t remainder = length%32;
    uint64 a=*hash1;
    uint64 b=*hash2;
    uint64 c=sc_const;
    uint64 d=sc_const;

    if (length > 15)
    {
        const uint64 *end = u.p64 + (length/32)*4;
        
        // handle all complete sets of 32 bytes
        for (; u.p64 < end; u.p64 += 4)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            a += u.p64[2];
            b += u.p64[3];
        }
        
        //Handle the case of 16+ remaining bytes.
        if (remainder >= 16)
        {
            c += u.p64[0];
            d += u.p64[1];
            ShortMix(a,b,c,d);
            u.p64 += 2;
            remainder -= 16;
        }
    }
    
    // Handle the last 0..15 bytes, and its length
    d = ((uint64)length) << 56;
    switch (remainder)
    {
    case 15:
    d += ((uint64)u.p8[14]) << 48;
    case 14:
        d += ((uint64)u.p8[13]) << 40;
    case 13:
        d += ((uint64)u.p8[12]) << 32;
    case 12:
        d += u.p32[2];
        c += u.p64[0];
        break;
    case 11:
        d += ((uint64)u.p8[10]) << 16;
    case 10:
        d += ((uint64)u.p8[9]) << 8;
    case 9:
        d += (uint64)u.p8[8];
    case 8:
        c += u.p64[0];
        break;
    case 7:
        c += ((uint64)u.p8[6]) << 48;
    case 6:
        c += ((uint64)u.p8[5]) << 40;
    case 5:
        c += ((uint64)u.p8[4]) << 32;
    case 4:
        c += u.p32[0];
        break;
    case 3:
        c += ((uint64)u.p8[2]) << 16;
    case 2:
        c += ((uint64)u.p8[1]) << 8;
    case 1:
        c += (uint64)u.p8[0];
        break;
    case 0:
        c += sc_const;
        d += sc_const;
    }
    ShortEnd(a,b,c,d);
    *hash1 = a;
    *hash2 = b;
}